

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O0

void __thiscall soplex::IdxSet::IdxSet(IdxSet *this,IdxSet *old)

{
  long in_RSI;
  undefined8 *in_RDI;
  int in_stack_0000002c;
  int **in_stack_00000030;
  
  *in_RDI = &PTR__IdxSet_00896150;
  *(undefined4 *)((long)in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  in_RDI[2] = 0;
  spx_alloc<int*>(in_stack_00000030,in_stack_0000002c);
  *(undefined4 *)(in_RDI + 1) = 0;
  while (*(int *)(in_RDI + 1) < *(int *)(in_RSI + 8)) {
    *(undefined4 *)(in_RDI[2] + (long)*(int *)(in_RDI + 1) * 4) =
         *(undefined4 *)(*(long *)(in_RSI + 0x10) + (long)*(int *)(in_RDI + 1) * 4);
    *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
  }
  *(undefined1 *)(in_RDI + 3) = 1;
  return;
}

Assistant:

IdxSet::IdxSet(const IdxSet& old)
   : len(old.len)
   , idx(nullptr)
{
   spx_alloc(idx, len);

   for(num = 0; num < old.num; num++)
      idx[num] = old.idx[num];

   freeArray = true;

   assert(size() == old.size());
   assert(size() <= max());
   assert(isConsistent());
}